

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolver.cpp
# Opt level: O3

double __thiscall
chrono::ChIterativeSolver::CheckSolution
          (ChIterativeSolver *this,ChSystemDescriptor *sysd,ChVectorDynamic<> *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ostream *poVar3;
  char *__function;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  ChVectorDynamic<> Zx;
  ChVectorDynamic<> b;
  ChSparseMatrix Z;
  scalar_sum_op<double,_double> local_f1;
  RealScalar local_f0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  Matrix<double,__1,_1,_0,__1,_1> local_d8;
  Scalar local_c8;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c0;
  SparseMatrix<double,_1,_int> local_98;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_48;
  undefined1 auVar4 [16];
  
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,0,&local_d8);
  local_98.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  local_98._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  local_98.m_outerSize = -1;
  local_98.m_innerSize = 0;
  local_98.m_outerIndex = (StorageIndex *)0x0;
  local_98.m_innerNonZeros = (StorageIndex *)0x0;
  local_98.m_data.m_values = (Scalar *)0x0;
  local_98.m_data.m_indices = (StorageIndex *)0x0;
  local_98.m_data.m_size = 0;
  local_98.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&local_98,0,0);
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&local_98,0);
  if (local_98.m_innerSize !=
      (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<double, 1>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_c0._0_8_ = &local_98;
  local_c0.m_xpr.m_lhs = x;
  local_c0.m_xpr.m_rhs = &local_d8;
  if (local_98.m_outerSize ==
      local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    local_f0 = Eigen::
               MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)&local_c0);
    local_e8.m_storage.m_data = (double *)0x0;
    local_e8.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_e8,
               (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
    ;
    (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_e8,x);
    if (local_e8.m_storage.m_rows ==
        local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      local_c0.m_xpr.m_lhs = (LhsNested)&local_e8;
      if (local_e8.m_storage.m_rows == 0) {
        local_c8 = 0.0;
        local_c0.m_xpr.m_rhs = &local_d8;
      }
      else {
        if (local_e8.m_storage.m_rows < 1) {
          local_c0.m_xpr.m_rhs = &local_d8;
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        local_48.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_double>
        .m_d.argImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_e8.m_storage.m_data;
        local_48.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_double>
        .m_d.argImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
        local_c0.m_xpr.m_rhs = &local_d8;
        local_c8 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             (&local_48,&local_f1,&local_c0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Residual norm (using full matrix): ",0x25);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_f0;
      auVar1 = vsqrtsd_avx(in_XMM1,auVar1);
      local_f0 = auVar1._0_8_;
      poVar3 = std::ostream::_M_insert<double>(local_f0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      auVar4._8_8_ = extraout_XMM1_Qb;
      auVar4._0_8_ = extraout_XMM1_Qa;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Residual norm (using SPMV):        ",0x25);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_c8;
      auVar1 = vsqrtsd_avx(auVar4,auVar2);
      poVar3 = std::ostream::_M_insert<double>(auVar1._0_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_e8.m_storage.m_data != (double *)0x0) {
        free((void *)local_e8.m_storage.m_data[-1]);
      }
      local_98._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
      free(local_98.m_outerIndex);
      free(local_98.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_98.m_data);
      if (local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          != (double *)0x0) {
        free((void *)local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[-1]);
      }
      return local_f0;
    }
    __function = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    __function = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

double ChIterativeSolver::CheckSolution(ChSystemDescriptor& sysd, const ChVectorDynamic<>& x) {
    ChVectorDynamic<> b;
    sysd.ConvertToMatrixForm(nullptr, &b);

    ChSparseMatrix Z;
    sysd.ConvertToMatrixForm(&Z, nullptr);
    double res_norm1 = (Z * x - b).norm();
    
    ChVectorDynamic<> Zx(x.size());
    sysd.SystemProduct(Zx, x);
    double res_norm2 = (Zx - b).norm();

    std::cout << "  Residual norm (using full matrix): " << res_norm1 << std::endl;
    std::cout << "  Residual norm (using SPMV):        " << res_norm2 << std::endl;

    return res_norm1;
}